

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_structure.h
# Opt level: O2

void __thiscall xLearn::DMatrix::DMatrix(DMatrix *this)

{
  allocator_type local_1b;
  allocator_type local_1a;
  allocator_type local_19;
  
  this->row_length = 0;
  this->hash_value_1 = 0;
  this->hash_value_2 = 0;
  std::
  vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
  ::vector(&this->row,0,&local_19);
  std::vector<float,_std::allocator<float>_>::vector(&this->Y,0,&local_1a);
  std::vector<float,_std::allocator<float>_>::vector(&this->norm,0,&local_1b);
  this->has_label = false;
  this->pos = 0;
  return;
}

Assistant:

DMatrix()
   : hash_value_1(0), 
     hash_value_2(0),
     row_length(0),
     row(0),
     Y(0),
     norm(0),
     has_label(false),
     pos(0) { }